

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O1

TA_RetCode
TA_GetOutputParameterInfo(TA_FuncHandle *handle,uint paramIndex,TA_OutputParameterInfo **info)

{
  TA_OutputParameterInfo *pTVar1;
  TA_RetCode TVar2;
  
  TVar2 = TA_BAD_PARAM;
  if (info != (TA_OutputParameterInfo **)0x0 && handle != (TA_FuncHandle *)0x0) {
    *info = (TA_OutputParameterInfo *)0x0;
    TVar2 = TA_INVALID_HANDLE;
    if (((*handle == 0xa201b201) && (*(long *)(handle + 2) != 0)) &&
       (TVar2 = TA_BAD_PARAM, paramIndex < *(uint *)(*(long *)(handle + 2) + 0x2c))) {
      if (*(long *)(handle + 8) == 0) {
        return TA_INTERNAL_ERROR|TA_GROUP_NOT_FOUND;
      }
      pTVar1 = *(TA_OutputParameterInfo **)(*(long *)(handle + 8) + (ulong)paramIndex * 8);
      *info = pTVar1;
      TVar2 = TA_INTERNAL_ERROR|TA_FUNC_NOT_FOUND;
      if (pTVar1 != (TA_OutputParameterInfo *)0x0) {
        TVar2 = TA_SUCCESS;
      }
    }
  }
  return TVar2;
}

Assistant:

TA_RetCode TA_GetOutputParameterInfo( const TA_FuncHandle *handle,
                                      unsigned int paramIndex,
                                      const TA_OutputParameterInfo **info )
{

   const TA_FuncDef  *funcDef;
   const TA_FuncInfo *funcInfo;
   const TA_OutputParameterInfo **outputTable;

   if( (handle == NULL) || (info == NULL) )
   {
      return TA_BAD_PARAM;
   }

   *info = NULL;

   /* Validate that this is a valid funcHandle. */
   funcDef = (const TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      return TA_INVALID_HANDLE;
   }

   funcInfo = funcDef->funcInfo;

   if( !funcInfo )
   {
      return TA_INVALID_HANDLE;
   }

   if( paramIndex >= funcInfo->nbOutput )
   {
      return TA_BAD_PARAM;
   }

   outputTable = (const TA_OutputParameterInfo **)funcDef->output;

   if( !outputTable )
   {
      return TA_INTERNAL_ERROR(4);
   }

   *info = outputTable[paramIndex];

   if( !(*info) )
   {
      return TA_INTERNAL_ERROR(5);
   }

   return TA_SUCCESS;
}